

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall
cmCTest::PopulateCustomVector
          (cmCTest *this,cmMakefile *mf,string *def,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec)

{
  cmValue cVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string *value;
  reference pbVar5;
  string local_390 [32];
  ostringstream local_370 [8];
  ostringstream cmCTestLog_msg_1;
  string *it;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  cmValue local_30;
  cmValue dval;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_local;
  string *def_local;
  cmMakefile *mf_local;
  cmCTest *this_local;
  
  dval.Value = (string *)vec;
  local_30 = cmMakefile::GetDefinition(mf,def);
  bVar2 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = std::operator<<((ostream *)local_1a8,"PopulateCustomVector: ");
    poVar3 = std::operator<<(poVar3,(string *)def);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xc53,pcVar4,false);
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    cVar1 = dval;
    value = cmValue::operator*[abi_cxx11_(&local_30);
    cmList::assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)cVar1.Value,value,No);
    cVar1 = dval;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)dval.Value);
    it = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(cVar1.Value);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&it), bVar2) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::ostringstream::ostringstream(local_370);
      poVar3 = std::operator<<((ostream *)local_370,"  -- ");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xc58,pcVar4,false);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::ostringstream::~ostringstream(local_370);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmCTest::PopulateCustomVector(cmMakefile* mf, const std::string& def,
                                   std::vector<std::string>& vec)
{
  cmValue dval = mf->GetDefinition(def);
  if (!dval) {
    return;
  }
  cmCTestLog(this, DEBUG, "PopulateCustomVector: " << def << std::endl);

  cmList::assign(vec, *dval);

  for (std::string const& it : vec) {
    cmCTestLog(this, DEBUG, "  -- " << it << std::endl);
  }
}